

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O2

int shareedge(cbtInt3 *a,cbtInt3 *b)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (lVar3 == 3) {
      return 0;
    }
    lVar2 = 0;
    if (lVar3 != 2) {
      lVar2 = lVar3 + 1;
    }
    iVar1 = hasedge(a,(&b->x)[lVar2],(&b->x)[lVar3]);
    lVar3 = lVar3 + 1;
  } while (iVar1 == 0);
  return 1;
}

Assistant:

int shareedge(const cbtInt3 &a, const cbtInt3 &b)
{
	int i;
	for (i = 0; i < 3; i++)
	{
		int i1 = (i + 1) % 3;
		if (hasedge(a, b[i1], b[i])) return 1;
	}
	return 0;
}